

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::RemoveCollisionModelsFromSystem(ChParticleCloud *this)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  pointer ppCVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((this->super_ChIndexedParticles).super_ChPhysicsItem.system != (ChSystem *)0x0) {
    ppCVar4 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->particles).
        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar4) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        pCVar1 = (this->super_ChIndexedParticles).super_ChPhysicsItem.system;
        peVar2 = (pCVar1->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        this_00 = (pCVar1->collision_system).
                  super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            ppCVar4 = (this->particles).
                      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        (*peVar2->_vptr_ChCollisionSystem[5])(peVar2,ppCVar4[uVar5]->collision_model);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        ppCVar4 = (this->particles).
                  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar6 < (ulong)((long)(this->particles).
                                      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >>
                               3);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar3);
    }
    return;
  }
  __assert_fail("GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChParticleCloud.cpp"
                ,0x298,"virtual void chrono::ChParticleCloud::RemoveCollisionModelsFromSystem()");
}

Assistant:

void ChParticleCloud::RemoveCollisionModelsFromSystem() {
    assert(GetSystem());
    for (unsigned int j = 0; j < particles.size(); j++) {
        GetSystem()->GetCollisionSystem()->Remove(particles[j]->collision_model);
    }
}